

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  pointer pPVar4;
  size_type sVar5;
  reference pvVar6;
  reference ppcVar7;
  char *pcVar8;
  bool local_331;
  undefined1 local_2c0 [4];
  int plevel;
  string parallel;
  undefined1 local_280 [8];
  ostringstream cmCTestLog_msg;
  cmCTestGenericHandler **handler;
  iterator __end2;
  iterator __begin2;
  vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *__range2;
  string input;
  string targ;
  string arg;
  undefined1 local_60 [8];
  string errormsg;
  size_t i;
  bool SRArgumentSpecified;
  bool executeTests;
  char *pcStack_30;
  bool cmakeAndTest;
  char *ctestExec;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTest *this_local;
  
  pcStack_30 = "ctest";
  i._7_1_ = 0;
  i._6_1_ = 1;
  i._5_1_ = 0;
  ctestExec = (char *)output;
  output_local = (string *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&pPVar4->InitialCommandLineArguments,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)output_local);
  errormsg.field_2._8_8_ = 1;
  do {
    uVar1 = errormsg.field_2._8_8_;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)output_local);
    if (sVar5 <= (ulong)uVar1) {
      pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      if ((pPVar4->ParallelLevelSetInCli & 1U) == 0) {
        std::__cxx11::string::string((string *)local_2c0);
        bVar2 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",(string *)local_2c0);
        if (bVar2) {
          pcVar8 = (char *)std::__cxx11::string::c_str();
          iVar3 = atoi(pcVar8);
          SetParallelLevel(this,iVar3);
        }
        std::__cxx11::string::~string((string *)local_2c0);
      }
      pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      local_331 = false;
      if ((pPVar4->TestProgressOutput & 1U) != 0) {
        pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        local_331 = false;
        if (pPVar4->OutputLogFile == (cmGeneratedFileStream *)0x0) {
          local_331 = ProgressOutputSupportedByConsole();
        }
      }
      pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      pPVar4->TestProgressOutput = local_331;
      if ((i._7_1_ & 1) == 0) {
        if ((i._6_1_ & 1) == 0) {
          this_local._4_4_ = 1;
        }
        else {
          this_local._4_4_ = ExecuteTests(this);
        }
      }
      else {
        this_local._4_4_ = RunCMakeAndTest(this,(string *)ctestExec);
      }
      return this_local._4_4_;
    }
    std::__cxx11::string::string((string *)local_60);
    bVar2 = HandleCommandLineArguments
                      (this,(size_t *)(errormsg.field_2._M_local_buf + 8),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)output_local,(string *)local_60);
    if (bVar2) {
      HandleScriptArguments
                (this,(size_t *)(errormsg.field_2._M_local_buf + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)output_local,(bool *)((long)&i + 5));
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)output_local,errormsg.field_2._8_8_);
      std::__cxx11::string::string((string *)(targ.field_2._M_local_buf + 8),(string *)pvVar6);
      bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"-D","--dashboard");
      uVar1 = errormsg.field_2._8_8_;
      if ((bVar2) &&
         (sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local), (ulong)uVar1 < sVar5 - 1)) {
        pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        pPVar4->ProduceXML = true;
        errormsg.field_2._8_8_ = errormsg.field_2._8_8_ + 1;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)output_local,errormsg.field_2._8_8_);
        std::__cxx11::string::string((string *)(input.field_2._M_local_buf + 8),(string *)pvVar6);
        bVar2 = AddTestsForDashboardType(this,(string *)((long)&input.field_2 + 8));
        if ((!bVar2) &&
           (bVar2 = AddVariableDefinition(this,(string *)((long)&input.field_2 + 8)), !bVar2)) {
          ErrorMessageUnknownDashDValue(this,(string *)((long)&input.field_2 + 8));
          i._6_1_ = 0;
        }
        std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
      }
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&targ.field_2 + 8),"-D");
      if (bVar2) {
        pcVar8 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::SystemTools::StringStartsWith(pcVar8,"-D");
        if (bVar2) {
          std::__cxx11::string::substr((ulong)&__range2,(ulong)((long)&targ.field_2 + 8));
          AddVariableDefinition(this,(string *)&__range2);
          std::__cxx11::string::~string((string *)&__range2);
        }
      }
      bVar2 = HandleTestActionArgument
                        (this,pcStack_30,(size_t *)(errormsg.field_2._M_local_buf + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local);
      if (!bVar2) {
        i._6_1_ = 0;
      }
      bVar2 = HandleTestModelArgument
                        (this,pcStack_30,(size_t *)(errormsg.field_2._M_local_buf + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local);
      if (!bVar2) {
        i._6_1_ = 0;
      }
      bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"--extra-submit",(char *)0x0);
      uVar1 = errormsg.field_2._8_8_;
      if ((bVar2) &&
         (sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local), (ulong)uVar1 < sVar5 - 1)) {
        pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        pPVar4->ProduceXML = true;
        SetTest(this,"Submit",true);
        errormsg.field_2._8_8_ = errormsg.field_2._8_8_ + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)output_local,errormsg.field_2._8_8_);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        bVar2 = SubmitExtraFiles(this,pcVar8);
        if (bVar2) goto LAB_00156283;
        this_local._4_4_ = 0;
        arg.field_2._8_4_ = 1;
      }
      else {
LAB_00156283:
        bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"--build-and-test",
                              (char *)0x0);
        uVar1 = errormsg.field_2._8_8_;
        if ((bVar2) &&
           (sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)output_local), (ulong)uVar1 < sVar5 - 1)) {
          i._7_1_ = 1;
        }
        bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"--schedule-random",
                              (char *)0x0);
        if (bVar2) {
          pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                   operator->(&this->Impl);
          std::__cxx11::string::operator=((string *)&pPVar4->ScheduleType,"Random");
        }
        pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        Private::GetTestingHandlers
                  ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                   &__begin2,pPVar4);
        __end2 = std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::
                 begin((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                       &__begin2);
        handler = (cmCTestGenericHandler **)
                  std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::
                  end((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                      &__begin2);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
                                           *)&handler), bVar2) {
          ppcVar7 = __gnu_cxx::
                    __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
                    ::operator*(&__end2);
          iVar3 = (*(*ppcVar7)->_vptr_cmCTestGenericHandler[2])
                            (*ppcVar7,(undefined1 *)((long)&targ.field_2 + 8),
                             (undefined1 *)((long)&errormsg.field_2 + 8),output_local);
          if (iVar3 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
            std::operator<<((ostream *)local_280,
                            "Problem parsing command line arguments within a handler");
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            Log(this,7,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
                ,0x8e2,pcVar8,false);
            std::__cxx11::string::~string((string *)(parallel.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
            this_local._4_4_ = 0;
            arg.field_2._8_4_ = 1;
            goto LAB_001564df;
          }
          __gnu_cxx::
          __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
          ::operator++(&__end2);
        }
        arg.field_2._8_4_ = 5;
LAB_001564df:
        std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::~vector
                  ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                   &__begin2);
        if (arg.field_2._8_4_ == 5) {
          arg.field_2._8_4_ = 0;
        }
      }
      std::__cxx11::string::~string((string *)(targ.field_2._M_local_buf + 8));
    }
    else {
      cmSystemTools::Error((string *)local_60);
      this_local._4_4_ = 1;
      arg.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_60);
    if (arg.field_2._8_4_ != 0) {
      return this_local._4_4_;
    }
    errormsg.field_2._8_8_ = errormsg.field_2._8_8_ + 1;
  } while( true );
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  cmAppend(this->Impl->InitialCommandLineArguments, args);

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg);
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i].c_str())) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random")) {
      this->Impl->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      if (!handler->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->Impl->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // TestProgressOutput only supported if console supports it and not logging
  // to a file
  this->Impl->TestProgressOutput = this->Impl->TestProgressOutput &&
    !this->Impl->OutputLogFile && this->ProgressOutputSupportedByConsole();
#ifdef _WIN32
  if (this->Impl->TestProgressOutput) {
    // Disable output line buffering so we can print content without
    // a newline.
    std::setvbuf(stdout, nullptr, _IONBF, 0);
  }
#endif

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}